

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_stamp.c
# Opt level: O2

err_t cmdStampVal(char *name,char *stamp_name)

{
  bool_t bVar1;
  err_t eVar2;
  err_t eVar3;
  size_t in_RAX;
  octet *stamp;
  size_t count;
  
  count = in_RAX;
  bVar1 = strIsValid(name);
  eVar3 = 0x6d;
  if ((bVar1 != 0) && (bVar1 = strIsValid(stamp_name), bVar1 != 0)) {
    bVar1 = cmdFileAreSame(name,stamp_name);
    if (bVar1 == 0) {
      stamp = (octet *)blobCreate(0x14);
      if (stamp == (octet *)0x0) {
        eVar3 = 0x6e;
      }
      else {
        eVar3 = cmdFileStamp(stamp,name,0);
        if (eVar3 == 0) {
          count = 10;
          eVar3 = cmdFileReadAll(stamp + 10,&count,stamp_name);
          if (eVar3 == 0) {
            bVar1 = memEq(stamp,stamp + 10,10);
            eVar3 = 0xd2;
            if (bVar1 != 0) {
              eVar3 = 0;
            }
          }
        }
        blobClose(stamp);
      }
    }
    else {
      eVar2 = cmdFileStamp((octet *)0x0,name,1);
      eVar3 = 0xd2;
      if (eVar2 != 0xffffffff) {
        eVar3 = eVar2;
      }
    }
  }
  return eVar3;
}

Assistant:

err_t cmdStampVal(const char* name, const char* stamp_name)
{
	err_t code;
	// входной контроль
	if (!strIsValid(name) || !strIsValid(stamp_name))
		return ERR_BAD_INPUT;
	// проверить прикрепленный штамп
	if (cmdFileAreSame(name, stamp_name))
	{
		code = cmdFileStamp(0, name, TRUE);
		if (code == ERR_MAX)
			code = ERR_FILE_STAMP;
	}
	// проверить открепленный штамп
	else
	{
		void* stack;
		octet* stamp;
		octet* stamp1;
		size_t count;
		// выделить и разметить память
		code = cmdBlobCreate(stack, 20);
		ERR_CALL_CHECK(code);
		stamp = (octet*)stack;
		stamp1 = stamp + 10;
		// вычислить штамп
		code = cmdFileStamp(stamp, name, FALSE);
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		// прочитать штамп
		count = 10;
		code = cmdFileReadAll(stamp1, &count, stamp_name);
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		// сравнить
		if (!memEq(stamp, stamp1, 10))
			code = ERR_FILE_STAMP;
		cmdBlobClose(stack);
	}
	return code;
}